

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.h
# Opt level: O0

void set_mb_mi(CommonModeInfoParams *mi_params,int width,int height)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int mi_alloc_size_1d;
  
  iVar1 = size_in_mi(in_ESI);
  in_RDI[4] = iVar1;
  iVar1 = size_in_mi(in_EDX);
  in_RDI[3] = iVar1;
  iVar1 = calc_mi_size(in_RDI[4]);
  in_RDI[0xf] = iVar1;
  in_RDI[1] = in_RDI[4] + 2 >> 2;
  *in_RDI = in_RDI[3] + 2 >> 2;
  in_RDI[2] = *in_RDI * in_RDI[1];
  in_RDI[9] = (int)(in_RDI[0xf] +
                    (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                          [*(byte *)(in_RDI + 10)] + -1) /
              (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                         [*(byte *)(in_RDI + 10)];
  return;
}

Assistant:

static inline void set_mb_mi(CommonModeInfoParams *mi_params, int width,
                             int height) {
  mi_params->mi_cols = size_in_mi(width);
  mi_params->mi_rows = size_in_mi(height);
  mi_params->mi_stride = calc_mi_size(mi_params->mi_cols);

  mi_params->mb_cols = ROUND_POWER_OF_TWO(mi_params->mi_cols, 2);
  mi_params->mb_rows = ROUND_POWER_OF_TWO(mi_params->mi_rows, 2);
  mi_params->MBs = mi_params->mb_rows * mi_params->mb_cols;

  const int mi_alloc_size_1d = mi_size_wide[mi_params->mi_alloc_bsize];
  mi_params->mi_alloc_stride =
      (mi_params->mi_stride + mi_alloc_size_1d - 1) / mi_alloc_size_1d;

  assert(mi_size_wide[mi_params->mi_alloc_bsize] ==
         mi_size_high[mi_params->mi_alloc_bsize]);
}